

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::Reflection
          (Reflection *this,Descriptor *descriptor,ReflectionSchema *schema,DescriptorPool *pool,
          MessageFactory *factory)

{
  long lVar1;
  ReflectionSchema *pRVar2;
  
  this->descriptor_ = descriptor;
  pRVar2 = &this->schema_;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pRVar2->default_instance_ = schema->default_instance_;
    schema = (ReflectionSchema *)&schema->offsets_;
    pRVar2 = (ReflectionSchema *)&pRVar2->offsets_;
  }
  if (pool == (DescriptorPool *)0x0) {
    pool = DescriptorPool::internal_generated_pool();
  }
  this->descriptor_pool_ = pool;
  this->message_factory_ = factory;
  this->last_non_weak_field_index_ = -1;
  this->tcparse_table_once_ = (atomic<unsigned_int>)0x0;
  this->tcparse_table_ = (TcParseTableBase *)0x0;
  this->last_non_weak_field_index_ = this->descriptor_->field_count_ + -1;
  return;
}

Assistant:

Reflection::Reflection(const Descriptor* descriptor,
                       const internal::ReflectionSchema& schema,
                       const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_(
          (pool == nullptr) ? DescriptorPool::internal_generated_pool() : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}